

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O2

void __thiscall MinVR::VRMain::setConfigValue(VRMain *this,string *keyAndValStr)

{
  string name;
  allocator<char> local_b2;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"- ",&local_b1);
  std::operator+(&local_70,"Setting config value:",keyAndValStr);
  std::operator+(&local_30,&local_50,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\n",&local_b2);
  std::operator+(&local_b0,&local_30,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::ostream::write((char *)&std::cout,(long)local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  VRDataIndex::addData(&local_b0,this->_config,keyAndValStr);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void VRMain::setConfigValue(const std::string &keyAndValStr) {
  VRLOG_STATUS("Setting config value:" + keyAndValStr);
  std::string name = _config->addData(keyAndValStr);
}